

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue.cpp
# Opt level: O0

string * __thiscall
libcellml::Issue::description_abi_cxx11_(string *__return_storage_ptr__,Issue *this)

{
  Issue *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->mPimpl);
  return __return_storage_ptr__;
}

Assistant:

std::string Issue::description() const
{
    return mPimpl->mDescription;
}